

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexMathFpu.cpp
# Opt level: O0

int Iex_3_4::FpuControl::setExceptionMask(int mask,int *exceptions)

{
  uint16_t cw_00;
  uint16_t uVar1;
  uint32_t mxcsr_00;
  int iVar2;
  uint *in_RSI;
  uint in_EDI;
  int oldmask;
  uint32_t mxcsr;
  uint16_t cw;
  
  cw_00 = getCw();
  mxcsr_00 = getMxcsr();
  if (in_RSI != (uint *)0x0) {
    uVar1 = getSw();
    *in_RSI = mxcsr_00 & 0x3f | uVar1 & 0x3f;
  }
  iVar2 = calcMask(cw_00,mxcsr_00);
  setCw(cw_00 & 0xffc0 | (ushort)(in_EDI & 0x3f));
  setMxcsr(mxcsr_00 & 0xffffe07f | (in_EDI & 0x3f) << 7,false);
  return iVar2;
}

Assistant:

inline int
setExceptionMask (int mask, int* exceptions)
{
    uint16_t cw    = getCw ();
    uint32_t mxcsr = getMxcsr ();

    if (exceptions) *exceptions = (mxcsr & ALL_EXC) | (getSw () & ALL_EXC);

    int oldmask = calcMask (cw, mxcsr);

    //
    // The exception constants are chosen very carefully so that
    // we can do a simple mask and shift operation to insert
    // them into the control words.  The mask operation is for
    // safety, in case the user accidentally set some other
    // bits in the exception mask.
    //

    mask &= ALL_EXC;
    cw    = (cw & ~ALL_EXC) | mask;
    mxcsr = (mxcsr & ~(ALL_EXC << 7)) | (mask << 7);

    setCw (cw);
    setMxcsr (mxcsr, false);

    return oldmask;
}